

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader_options.hpp
# Opt level: O0

CSVReaderOptions * __thiscall
duckdb::CSVReaderOptions::operator=(CSVReaderOptions *this,CSVReaderOptions *param_2)

{
  undefined4 uVar1;
  undefined1 uVar2;
  undefined2 uVar3;
  char cVar4;
  DialectOptions *in_RSI;
  CSVReaderOptions *in_RDI;
  
  DialectOptions::operator=(in_RSI,&in_RDI->dialect_options);
  uVar2 = in_RSI[1].state_machine_options.delimiter.field_0x1;
  uVar3 = *(undefined2 *)&in_RSI[1].state_machine_options.delimiter.field_0x2;
  (in_RDI->ignore_errors).set_by_user = in_RSI[1].state_machine_options.delimiter.set_by_user;
  (in_RDI->ignore_errors).value = (bool)uVar2;
  (in_RDI->store_rejects).set_by_user = (bool)(char)uVar3;
  (in_RDI->store_rejects).value = (bool)(char)((ushort)uVar3 >> 8);
  CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator=((CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_RSI,
            (CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_RDI);
  CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator=((CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_RSI,
            (CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_RDI);
  in_RDI->rejects_limit =
       (idx_t)in_RSI[1].date_format._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  in_RDI->buffer_sample_size =
       (idx_t)in_RSI[1].date_format._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
  operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             *)in_RSI,
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             *)in_RDI);
  uVar1 = (undefined4)in_RSI[1].skip_rows.value;
  in_RDI->compression = (char)uVar1;
  in_RDI->allow_quoted_nulls = (bool)(char)((uint)uVar1 >> 8);
  in_RDI->comment = (char)((uint)uVar1 >> 0x10);
  in_RDI->thousands_separator = (char)((uint)uVar1 >> 0x18);
  ::std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::operator=((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               *)in_RSI,
              (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               *)in_RDI);
  vector<duckdb::LogicalType,_true>::operator=
            ((vector<duckdb::LogicalType,_true> *)in_RSI,(vector<duckdb::LogicalType,_true> *)in_RDI
            );
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
  operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             *)in_RSI,
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             *)in_RDI);
  in_RDI->columns_set =
       (bool)(*(byte *)&in_RSI[2].date_format._M_t._M_impl.super__Rb_tree_header._M_header._M_left &
             1);
  vector<duckdb::LogicalType,_true>::operator=
            ((vector<duckdb::LogicalType,_true> *)in_RSI,(vector<duckdb::LogicalType,_true> *)in_RDI
            );
  ::std::__cxx11::string::operator=
            ((string *)&in_RDI->sniffer_user_mismatch_error,(string *)&in_RSI[2].skip_rows.value);
  vector<bool,_true>::operator=((vector<bool,_true> *)in_RSI,(vector<bool,_true> *)in_RDI);
  *(idx_t *)&in_RDI->maximum_line_size = in_RSI[3].num_cols;
  (in_RDI->maximum_line_size).value = *(unsigned_long *)&in_RSI[3].header;
  in_RDI->normalize_names = *(bool *)&in_RSI[3].date_format._M_t._M_impl;
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_RSI,
              (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_RDI);
  vector<bool,_true>::operator=((vector<bool,_true> *)in_RSI,(vector<bool,_true> *)in_RDI);
  in_RDI->sample_size_chunks =
       *(idx_t *)((long)&in_RSI[4].state_machine_options.delimiter.value.field_2 + 8);
  cVar4 = in_RSI[4].state_machine_options.quote.value;
  in_RDI->all_varchar = in_RSI[4].state_machine_options.quote.set_by_user;
  in_RDI->auto_detect = (bool)cVar4;
  ::std::__cxx11::string::operator=
            ((string *)&in_RDI->file_path,(string *)&in_RSI[4].state_machine_options.strict_mode);
  *(undefined8 *)&in_RDI->buffer_size_option =
       *(undefined8 *)&in_RSI[4].date_format._M_t._M_impl.super__Rb_tree_header._M_header;
  (in_RDI->buffer_size_option).value =
       (unsigned_long)in_RSI[4].date_format._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  ::std::__cxx11::string::operator=
            ((string *)&in_RDI->decimal_separator,
             (string *)&in_RSI[4].date_format._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
  uVar3 = (undefined2)in_RSI[4].skip_rows.value;
  in_RDI->null_padding = (bool)(char)uVar3;
  in_RDI->parallel = (bool)(char)((ushort)uVar3 >> 8);
  ::std::__cxx11::string::operator=
            ((string *)&in_RDI->encoding,(string *)&in_RSI[4].rows_until_header);
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator=((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)in_RSI,
              (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)in_RDI);
  vector<bool,_true>::operator=((vector<bool,_true> *)in_RSI,(vector<bool,_true> *)in_RDI);
  ::std::__cxx11::string::operator=
            ((string *)&in_RDI->prefix,
             (string *)&in_RSI[5].date_format._M_t._M_impl.super__Rb_tree_header._M_node_count);
  ::std::__cxx11::string::operator=((string *)&in_RDI->suffix,(string *)(in_RSI + 6));
  ::std::__cxx11::string::operator=
            ((string *)&in_RDI->write_newline,
             (string *)(in_RSI[6].state_machine_options.delimiter.value.field_2._M_local_buf + 8));
  ::std::
  map<duckdb::LogicalTypeId,_duckdb::Value,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::Value>_>_>
  ::operator=((map<duckdb::LogicalTypeId,_duckdb::Value,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::Value>_>_>
               *)in_RSI,
              (map<duckdb::LogicalTypeId,_duckdb::Value,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::Value>_>_>
               *)in_RDI);
  ::std::
  map<duckdb::LogicalTypeId,_bool,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_bool>_>_>
  ::operator=((map<duckdb::LogicalTypeId,_bool,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_bool>_>_>
               *)in_RSI,
              (map<duckdb::LogicalTypeId,_bool,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_bool>_>_>
               *)in_RDI);
  in_RDI->multi_file_reader =
       (bool)((byte)in_RSI[7].state_machine_options.delimiter.value._M_string_length & 1);
  return in_RDI;
}

Assistant:

CSVReaderOptions() {
	}